

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.hpp
# Opt level: O3

void __thiscall options2::options2(options2 *this,uint argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  char **ppcVar4;
  uint uVar5;
  char *__end;
  bool bVar6;
  string local_d0;
  allocator local_aa;
  allocator local_a9;
  string *local_a8;
  string *local_a0;
  string *local_98;
  string *local_90;
  string *local_88;
  uint local_7c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  this->valid = true;
  this->prec = 0xf;
  local_90 = (string *)&this->Jx;
  local_58 = &(this->Jx).field_2;
  (this->Jx)._M_dataplus._M_p = (pointer)local_58;
  std::__cxx11::string::_M_construct<char_const*>(local_90,"1","");
  local_98 = (string *)&this->Jy;
  local_60 = &(this->Jy).field_2;
  (this->Jy)._M_dataplus._M_p = (pointer)local_60;
  std::__cxx11::string::_M_construct<char_const*>(local_98,"1","");
  local_68 = &(this->Tmin).field_2;
  (this->Tmin)._M_dataplus._M_p = (pointer)local_68;
  (this->Tmin)._M_string_length = 0;
  (this->Tmin).field_2._M_local_buf[0] = '\0';
  local_70 = &(this->Tmax).field_2;
  (this->Tmax)._M_dataplus._M_p = (pointer)local_70;
  (this->Tmax)._M_string_length = 0;
  (this->Tmax).field_2._M_local_buf[0] = '\0';
  local_78 = &(this->dT).field_2;
  (this->dT)._M_dataplus._M_p = (pointer)local_78;
  (this->dT)._M_string_length = 0;
  (this->dT).field_2._M_local_buf[0] = '\0';
  if (argc != 0) {
    local_88 = (string *)&this->dT;
    if (argc == 1) {
      help_abi_cxx11_(&local_d0,this,*argv);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,local_d0._M_dataplus._M_p,local_d0._M_string_length);
LAB_0012888f:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_7c = argc - 2;
      uVar5 = 0;
      local_a8 = (string *)&this->Tmax;
      local_a0 = (string *)&this->Tmin;
      do {
        std::__cxx11::string::string((string *)&local_d0,argv[uVar5 + 1],&local_a9);
        ppcVar4 = argv + (uVar5 + 1);
        iVar2 = std::__cxx11::string::compare((char *)&local_d0);
        if (iVar2 == 0) {
          bVar6 = true;
        }
        else {
          std::__cxx11::string::string((string *)local_50,*ppcVar4,&local_aa);
          iVar2 = std::__cxx11::string::compare((char *)local_50);
          bVar6 = iVar2 == 0;
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if (bVar6) {
          help_abi_cxx11_(&local_d0,this,*argv);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,local_d0._M_dataplus._M_p,local_d0._M_string_length);
          goto LAB_0012888f;
        }
        pcVar1 = *ppcVar4;
        if (*pcVar1 != '-') {
          switch(~uVar5 + argc) {
          case 1:
            std::__cxx11::string::operator=(local_98,"1");
            std::__cxx11::string::_M_assign(local_90);
            goto LAB_001288fc;
          case 2:
            std::__cxx11::string::operator=(local_98,pcVar1);
            std::__cxx11::string::_M_assign(local_90);
            uVar5 = uVar5 + 2;
            break;
          case 3:
            std::__cxx11::string::operator=(local_90,pcVar1);
            std::__cxx11::string::operator=(local_98,argv[uVar5 + 2]);
            uVar5 = uVar5 + 3;
            break;
          default:
            help_abi_cxx11_(&local_d0,this,*argv);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,local_d0._M_dataplus._M_p,local_d0._M_string_length);
            goto LAB_0012888f;
          case 5:
            std::__cxx11::string::operator=(local_90,pcVar1);
            std::__cxx11::string::operator=(local_98,argv[uVar5 + 2]);
            std::__cxx11::string::operator=(local_a0,argv[uVar5 + 3]);
            std::__cxx11::string::operator=(local_a8,argv[uVar5 + 4]);
            std::__cxx11::string::operator=(local_88,argv[uVar5 + 5]);
            return;
          }
          ppcVar4 = argv + uVar5;
LAB_001288fc:
          std::__cxx11::string::operator=(local_88,*ppcVar4);
          std::__cxx11::string::_M_assign(local_a8);
          std::__cxx11::string::_M_assign(local_a0);
          return;
        }
        if (pcVar1[1] != 'p') {
          help_abi_cxx11_(&local_d0,this,*argv);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,local_d0._M_dataplus._M_p,local_d0._M_string_length);
          goto LAB_0012888f;
        }
        if (local_7c == uVar5) {
          help_abi_cxx11_(&local_d0,this,*argv);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,local_d0._M_dataplus._M_p,local_d0._M_string_length);
          goto LAB_0012888f;
        }
        uVar3 = atoi(argv[uVar5 + 2]);
        this->prec = uVar3;
        uVar3 = uVar5 + 3;
        uVar5 = uVar5 + 2;
      } while (uVar3 < argc);
    }
  }
  return;
}

Assistant:

options2(unsigned argc, char *argv[])
      : valid(true), prec(15), Jx("1"), Jy("1") {
    if (argc == 1) {
      std::cerr << help(argv[0]);
      return;
    }
    for (unsigned i = 1; i < argc; ++i) {
      if (std::string(argv[i]) == "-h" || std::string(argv[i]) == "--help") {
        std::cerr << help(argv[0]);
        return;
      }
      switch (argv[i][0]) {
        case '-':
          switch (argv[i][1]) {
            case 'p':
              if (++i == argc) {
                std::cerr << help(argv[0]);
                return;
              }
              prec = atoi(argv[i]);
              break;
            default:
              std::cerr << help(argv[0]);
              return;
          }
          break;
        default:
          switch (argc - i) {
            case 1:
              Jx = Jy = "1";
              Tmin = Tmax = dT = argv[i];
              return;
            case 2:
              Jx = Jy = argv[i];
              Tmin = Tmax = dT = argv[i + 1];
              return;
            case 3:
              Jx = argv[i];
              Jy = argv[i + 1];
              Tmin = Tmax = dT = argv[i + 2];
              return;
            case 5:
              Jx = argv[i];
              Jy = argv[i + 1];
              Tmin = argv[i + 2];
              Tmax = argv[i + 3];
              dT = argv[i + 4];
              return;
            default:
              std::cerr << help(argv[0]);
              return;
          }
      }
    }
  }